

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cc
# Opt level: O1

Expression __thiscall
cnn::SimpleRNNBuilder::add_input_impl(SimpleRNNBuilder *this,int prev,Expression *in)

{
  undefined8 *puVar1;
  long lVar2;
  undefined8 *in_RCX;
  long lVar3;
  undefined4 in_register_00000034;
  long lVar4;
  ulong uVar5;
  long lVar6;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  Expression EVar7;
  Expression y;
  iterator local_c0;
  undefined4 local_b8;
  initializer_list<cnn::expr::Expression> local_b0;
  Expression local_a0;
  undefined8 local_90;
  undefined4 local_88;
  iterator local_80;
  undefined4 local_78;
  ulong local_70;
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  *local_68;
  long local_60;
  initializer_list<cnn::expr::Expression> local_58;
  SimpleRNNBuilder *local_48;
  long local_40;
  long local_38;
  
  lVar4 = CONCAT44(in_register_00000034,prev);
  lVar3 = *(long *)(lVar4 + 0x60);
  lVar6 = *(long *)(lVar4 + 0x58);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)&local_a0,
             (ulong)*(uint *)(lVar4 + 0x88),(allocator_type *)&local_c0);
  local_68 = (vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
              *)(lVar4 + 0x58);
  std::
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  ::emplace_back<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
            ((vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
              *)(lVar4 + 0x58),
             (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)&local_a0);
  local_48 = this;
  if (local_a0.pg != (ComputationGraph *)0x0) {
    operator_delete(local_a0.pg);
  }
  local_70 = (lVar3 - lVar6 >> 3) * -0x5555555555555555;
  if (*(int *)(lVar4 + 0x88) != 0) {
    local_a0.i.t = *(uint *)(in_RCX + 1);
    local_a0.pg = (ComputationGraph *)*in_RCX;
    lVar6 = 8;
    lVar3 = 0;
    local_40 = ((ulong)in & 0xffffffff) * 3;
    local_38 = (local_70 & 0xffffffff) * 3;
    uVar5 = 0;
    local_60 = lVar4;
    do {
      lVar4 = *(long *)(local_60 + 0x40);
      puVar1 = *(undefined8 **)(lVar4 + lVar3);
      local_90 = *puVar1;
      local_88 = *(undefined4 *)(puVar1 + 1);
      local_b0._M_len = 3;
      local_b0._M_array = (iterator)&local_a0;
      local_80 = (iterator)local_a0.pg;
      local_a0.pg = (ComputationGraph *)puVar1[4];
      local_78 = local_a0.i.t;
      local_a0.i.t = *(uint *)(puVar1 + 5);
      expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                ((detail *)&local_c0,&local_b0);
      if (((int)in == -1) &&
         (lVar2 = *(long *)(local_60 + 0x70), *(long *)(local_60 + 0x78) != lVar2)) {
        local_90 = *(undefined8 *)(*(long *)(lVar4 + lVar3) + 0x10);
        local_88 = *(undefined4 *)(*(long *)(lVar4 + lVar3) + 0x18);
LAB_0027bc83:
        local_a0.i.t = local_b8;
        local_a0.pg = (ComputationGraph *)local_c0;
        local_80 = *(iterator *)(lVar2 + -8 + lVar6);
        local_78 = *(uint *)(lVar2 + lVar6);
        local_58._M_len = 3;
        local_58._M_array = (iterator)&local_a0;
        expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&local_b0,&local_58);
        local_c0 = local_b0._M_array;
        local_b8 = (uint)local_b0._M_len;
        __x = extraout_XMM0_Qa_00;
      }
      else {
        __x = extraout_XMM0_Qa;
        if (-1 < (int)in) {
          local_90 = *(undefined8 *)(*(long *)(lVar4 + lVar3) + 0x10);
          local_88 = *(undefined4 *)(*(long *)(lVar4 + lVar3) + 0x18);
          lVar2 = *(long *)(*(long *)local_68 + local_40 * 8);
          goto LAB_0027bc83;
        }
      }
      expr::tanh((expr *)&local_a0,__x);
      lVar4 = *(long *)(*(long *)(local_60 + 0x58) + local_38 * 8);
      *(ComputationGraph **)(lVar4 + -8 + lVar6) = local_a0.pg;
      *(uint *)(lVar4 + lVar6) = local_a0.i.t;
      uVar5 = uVar5 + 1;
      lVar3 = lVar3 + 0x18;
      lVar6 = lVar6 + 0x10;
    } while (uVar5 < *(uint *)(local_60 + 0x88));
  }
  lVar3 = *(long *)(*(long *)local_68 + 8 + (local_70 & 0xffffffff) * 0x18);
  (local_48->super_RNNBuilder)._vptr_RNNBuilder = *(_func_int ***)(lVar3 + -0x10);
  (local_48->super_RNNBuilder).cur.t = *(int *)(lVar3 + -8);
  EVar7._8_8_ = lVar3;
  EVar7.pg = (ComputationGraph *)local_48;
  return EVar7;
}

Assistant:

Expression SimpleRNNBuilder::add_input_impl(int prev, const Expression &in) {
  const unsigned t = h.size();
  h.push_back(vector<Expression>(layers));

  Expression x = in;

  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];

    // y <--- f(x)
    Expression y = affine_transform({vars[2], vars[0], x});

    // y <--- g(y_prev)
    if (prev == -1 && h0.size() > 0)
      y = affine_transform({y, vars[1], h0[i]});
    else if (prev >= 0)
      y = affine_transform({y, vars[1], h[prev][i]});

    // x <--- tanh(y)
    x = h[t][i] = tanh(y);
  }
  return h[t].back();
}